

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::ToCSharpName
                   (string *__return_storage_ptr__,string *name,FileDescriptor *file)

{
  bool bVar1;
  ulong uVar2;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0;
  string local_90 [32];
  undefined1 local_70 [8];
  string classname;
  undefined1 local_40 [8];
  string result;
  FileDescriptor *file_local;
  string *name_local;
  
  result.field_2._8_8_ = file;
  GetFileNamespace_abi_cxx11_((string *)local_40,(csharp *)file,file);
  bVar1 = std::operator!=((string *)local_40,"");
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)local_40,'.');
  }
  std::__cxx11::string::string((string *)local_70);
  FileDescriptor::package_abi_cxx11_((FileDescriptor *)result.field_2._8_8_);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    FileDescriptor::package_abi_cxx11_((FileDescriptor *)result.field_2._8_8_);
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_90,(ulong)name);
    std::__cxx11::string::operator=((string *)local_70,local_90);
    std::__cxx11::string::~string(local_90);
  }
  else {
    std::__cxx11::string::operator=((string *)local_70,(string *)name);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,".",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8,".Types.",&local_f9);
  StringReplace(&local_b0,(string *)local_70,&local_d0,&local_f8,true);
  std::__cxx11::string::operator+=((string *)local_40,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::operator+(__return_storage_ptr__,"global::",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ToCSharpName(const std::string& name, const FileDescriptor* file) {
  std::string result = GetFileNamespace(file);
  if (result != "") {
    result += '.';
  }
  string classname;
  if (file->package().empty()) {
    classname = name;
  } else {
    // Strip the proto package from full_name since we've replaced it with
    // the C# namespace.
    classname = name.substr(file->package().size() + 1);
  }
  result += StringReplace(classname, ".", ".Types.", true);
  return "global::" + result;
}